

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

string * resourcePath(string *__return_storage_ptr__,string *resourceRelativePath)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&TESTS_RESOURCE_LOCATION_abi_cxx11_,"/");
  std::operator+(__return_storage_ptr__,&bStack_38,resourceRelativePath);
  std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string resourcePath(const std::string &resourceRelativePath)
{
    return TESTS_RESOURCE_LOCATION + "/" + resourceRelativePath;
}